

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowMetricsWindow(bool *p_open)

{
  ImGuiMetricsConfig *p_open_00;
  bool *pbVar1;
  ImVector<unsigned_int> *pIVar2;
  ImVec2 IVar3;
  int iVar4;
  ImGuiWindow *pIVar5;
  ImGuiWindow **ppIVar6;
  ImGuiViewportP *pIVar7;
  ImGuiPopupData *pIVar8;
  undefined8 *puVar9;
  ImFontAtlas *atlas;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ImGuiContext *pIVar12;
  ImGuiContext *pIVar13;
  bool bVar14;
  ImGuiContext *g;
  long lVar15;
  ImDrawList *pIVar16;
  ulong uVar17;
  ImU32 col;
  long lVar18;
  ulong uVar19;
  char *pcVar20;
  char *pcVar21;
  int rect_n;
  int iVar22;
  ulong uVar23;
  ImGuiWindowSettings *settings;
  ImGuiTableSettings *settings_00;
  int draw_list_i;
  long lVar24;
  undefined **ppuVar25;
  char **ppcVar26;
  int i;
  ImVector<ImDrawList_*> *pIVar27;
  int viewport_i;
  ImGuiTable *pIVar28;
  ImGuiTabBar *pIVar29;
  int column_n;
  uint uVar30;
  byte bVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  float fVar35;
  float fVar36;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined1 auVar39 [16];
  ImRect IVar40;
  ImVec2 local_1c8;
  int *local_1c0;
  undefined1 local_1b8 [16];
  int *local_1a8;
  ImVec2 local_1a0;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  undefined8 local_188;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  float local_168;
  float fStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  char buf [128];
  char *wrt_rects_names [8];
  char *trt_rects_names [13];
  
  pIVar12 = GImGui;
  bVar31 = 0;
  p_open_00 = &GImGui->DebugMetricsConfig;
  if ((GImGui->DebugMetricsConfig).ShowStackTool == true) {
    ShowStackToolWindow(&p_open_00->ShowStackTool);
  }
  bVar14 = Begin("Dear ImGui Metrics/Debugger",p_open,0);
  if ((bVar14) &&
     (pIVar5 = GImGui->CurrentWindow, pIVar5->WriteAccessed = true, pIVar5->BeginCount < 2)) {
    Text("Dear ImGui %s","1.88 WIP");
    fVar35 = (pIVar12->IO).Framerate;
    Text("Application average %.3f ms/frame (%.1f FPS)",SUB84((double)(1000.0 / fVar35),0),
         SUB84((double)fVar35,0));
    uVar30 = (pIVar12->IO).MetricsRenderIndices;
    Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)(pIVar12->IO).MetricsRenderVertices,
         (ulong)uVar30,(long)(int)uVar30 / 3 & 0xffffffff);
    Text("%d visible windows, %d active allocations",(ulong)(uint)(pIVar12->IO).MetricsRenderWindows
         ,(ulong)(uint)(pIVar12->IO).MetricsActiveAllocations);
    Separator();
    wrt_rects_names[6] = "ContentIdeal";
    wrt_rects_names[7] = "ContentRegionRect";
    wrt_rects_names[4] = "WorkRect";
    wrt_rects_names[5] = "Content";
    wrt_rects_names[2] = "InnerRect";
    wrt_rects_names[3] = "InnerClipRect";
    wrt_rects_names[0] = "OuterRect";
    wrt_rects_names[1] = "OuterRectClipped";
    ppuVar25 = &PTR_anon_var_dwarf_238a2_0019d2a0;
    ppcVar26 = trt_rects_names;
    for (lVar18 = 0xd; lVar18 != 0; lVar18 = lVar18 + -1) {
      *ppcVar26 = *ppuVar25;
      ppuVar25 = ppuVar25 + (ulong)bVar31 * -2 + 1;
      ppcVar26 = ppcVar26 + (ulong)bVar31 * -2 + 1;
    }
    local_1a8 = &(pIVar12->DebugMetricsConfig).ShowWindowsRectsType;
    if ((pIVar12->DebugMetricsConfig).ShowWindowsRectsType < 0) {
      *local_1a8 = 4;
    }
    local_1c0 = &(pIVar12->DebugMetricsConfig).ShowTablesRectsType;
    if ((pIVar12->DebugMetricsConfig).ShowTablesRectsType < 0) {
      *local_1c0 = 2;
    }
    bVar14 = TreeNode("Tools");
    if (bVar14) {
      Checkbox("Show stack tool",&p_open_00->ShowStackTool);
      SameLine(0.0,-1.0);
      MetricsHelpMarker("You can also call ImGui::ShowStackToolWindow() from your code.");
      Checkbox("Show windows begin order",&(pIVar12->DebugMetricsConfig).ShowWindowsBeginOrder);
      Checkbox("Show windows rectangles",&(pIVar12->DebugMetricsConfig).ShowWindowsRects);
      SameLine(0.0,-1.0);
      pIVar13 = GImGui;
      fVar35 = GImGui->FontSize;
      (GImGui->NextItemData).Flags = (GImGui->NextItemData).Flags | 1;
      (pIVar13->NextItemData).Width = fVar35 * 12.0;
      bVar14 = Combo("##show_windows_rect_type",local_1a8,wrt_rects_names,8,8);
      pbVar1 = &(pIVar12->DebugMetricsConfig).ShowWindowsRects;
      *pbVar1 = (bool)(*pbVar1 | bVar14);
      if ((*pbVar1 != false) && (pIVar12->NavWindow != (ImGuiWindow *)0x0)) {
        BulletText("\'%s\':",pIVar12->NavWindow->Name);
        Indent(0.0);
        for (lVar18 = 0; lVar18 != 8; lVar18 = lVar18 + 1) {
          IVar40 = ShowMetricsWindow::Funcs::GetWindowRect(pIVar12->NavWindow,(int)lVar18);
          Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",SUB84((double)IVar40.Min.x,0),
               SUB84((double)IVar40.Min.y,0),(double)IVar40.Max.x,SUB84((double)IVar40.Max.y,0),
               SUB84((double)(IVar40.Max.x - IVar40.Min.x),0),(double)(IVar40.Max.y - IVar40.Min.y),
               wrt_rects_names[lVar18]);
        }
        Unindent(0.0);
      }
      Checkbox("Show tables rectangles",&(pIVar12->DebugMetricsConfig).ShowTablesRects);
      uVar37 = 0;
      uVar38 = 0;
      SameLine(0.0,-1.0);
      pIVar13 = GImGui;
      fVar35 = GImGui->FontSize;
      (GImGui->NextItemData).Flags = (GImGui->NextItemData).Flags | 1;
      (pIVar13->NextItemData).Width = fVar35 * 12.0;
      bVar14 = Combo("##show_table_rects_type",local_1c0,trt_rects_names,0xd,0xd);
      pbVar1 = &(pIVar12->DebugMetricsConfig).ShowTablesRects;
      *pbVar1 = (bool)(*pbVar1 | bVar14);
      if ((*pbVar1 != false) && (pIVar12->NavWindow != (ImGuiWindow *)0x0)) {
        for (lVar18 = 0; lVar18 < (pIVar12->Tables).Map.Data.Size; lVar18 = lVar18 + 1) {
          pIVar28 = (pIVar12->Tables).Buf.Data;
          lVar15 = (long)(pIVar12->Tables).Map.Data.Data[lVar18].field_1.val_i;
          if (((pIVar28 != (ImGuiTable *)0x0 && lVar15 != -1) &&
              (pIVar28 = pIVar28 + lVar15, pIVar12->FrameCount + -1 <= pIVar28->LastFrameActive)) &&
             ((pIVar28->OuterWindow == pIVar12->NavWindow ||
              (pIVar28->InnerWindow == pIVar12->NavWindow)))) {
            local_188 = lVar18;
            BulletText("Table 0x%08X (%d columns, in \'%s\')",(ulong)pIVar28->ID,
                       (ulong)(uint)pIVar28->ColumnsCount);
            bVar14 = IsItemHovered(0);
            if (bVar14) {
              pIVar16 = GetForegroundDrawList();
              auVar11 = buf._0_16_;
              IVar3 = (pIVar28->OuterRect).Min;
              buf._4_4_ = IVar3.y + -1.0;
              buf._0_4_ = IVar3.x + -1.0;
              buf._8_8_ = auVar11._8_8_;
              IVar3 = (pIVar28->OuterRect).Max;
              local_1c8.y = IVar3.y + 1.0;
              local_1c8.x = IVar3.x + 1.0;
              uVar37 = 0;
              uVar38 = 0;
              ImDrawList::AddRect(pIVar16,(ImVec2 *)buf,&local_1c8,0xff00ffff,0.0,0,2.0);
            }
            Indent(0.0);
            for (uVar23 = 0; uVar23 != 0xd; uVar23 = uVar23 + 1) {
              iVar22 = (int)uVar23;
              if (uVar23 < 6) {
                IVar40 = ShowMetricsWindow::Funcs::GetTableRect(pIVar28,iVar22,-1);
                local_1b8._8_4_ = uVar37;
                local_1b8._0_4_ = IVar40.Max.x;
                local_1b8._4_4_ = IVar40.Max.y;
                local_1b8._12_4_ = uVar38;
                fStack_190 = (float)extraout_XMM0_Dc_00;
                local_198._0_4_ = IVar40.Min.x;
                local_198._4_4_ = IVar40.Min.y;
                fStack_18c = (float)extraout_XMM0_Dd_00;
                ImFormatString(buf,0x80,"(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",
                               SUB84((double)IVar40.Min.x,0),SUB84((double)IVar40.Min.y,0),
                               (double)IVar40.Max.x,SUB84((double)IVar40.Max.y,0),
                               SUB84((double)(IVar40.Max.x - IVar40.Min.x),0),
                               (double)(IVar40.Max.y - IVar40.Min.y),trt_rects_names[uVar23]);
                local_1c8.x = 0.0;
                local_1c8.y = 0.0;
                Selectable(buf,false,0,&local_1c8);
                bVar14 = IsItemHovered(0);
                if (bVar14) {
                  pIVar16 = GetForegroundDrawList();
                  local_1c8.y = (float)local_198._4_4_ + -1.0;
                  local_1c8.x = (float)local_198._0_4_ + -1.0;
                  local_1a0.y = (float)local_1b8._4_4_ + 1.0;
                  local_1a0.x = (float)local_1b8._0_4_ + 1.0;
                  uVar37 = 0;
                  uVar38 = 0;
                  ImDrawList::AddRect(pIVar16,&local_1c8,&local_1a0,0xff00ffff,0.0,0,2.0);
                }
              }
              else if ((iVar22 == 8) || (iVar22 == 6)) {
                for (uVar30 = 0; (int)uVar30 < pIVar28->ColumnsCount; uVar30 = uVar30 + 1) {
                  IVar40 = ShowMetricsWindow::Funcs::GetTableRect(pIVar28,iVar22,uVar30);
                  local_1b8._8_4_ = uVar37;
                  local_1b8._0_4_ = IVar40.Max.x;
                  local_1b8._4_4_ = IVar40.Max.y;
                  local_1b8._12_4_ = uVar38;
                  fStack_190 = (float)extraout_XMM0_Dc;
                  local_198._0_4_ = IVar40.Min.x;
                  local_198._4_4_ = IVar40.Min.y;
                  fStack_18c = (float)extraout_XMM0_Dd;
                  ImFormatString(buf,0x80,"(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s"
                                 ,SUB84((double)IVar40.Min.x,0),SUB84((double)IVar40.Min.y,0),
                                 (double)IVar40.Max.x,SUB84((double)IVar40.Max.y,0),
                                 SUB84((double)(IVar40.Max.x - IVar40.Min.x),0),
                                 (double)(IVar40.Max.y - IVar40.Min.y),(ulong)uVar30);
                  local_1c8.x = 0.0;
                  local_1c8.y = 0.0;
                  Selectable(buf,false,0,&local_1c8);
                  bVar14 = IsItemHovered(0);
                  if (bVar14) {
                    pIVar16 = GetForegroundDrawList();
                    local_1c8.y = (float)local_198._4_4_ + -1.0;
                    local_1c8.x = (float)local_198._0_4_ + -1.0;
                    local_1a0.y = (float)local_1b8._4_4_ + 1.0;
                    local_1a0.x = (float)local_1b8._0_4_ + 1.0;
                    uVar37 = 0;
                    uVar38 = 0;
                    ImDrawList::AddRect(pIVar16,&local_1c8,&local_1a0,0xff00ffff,0.0,0,2.0);
                  }
                }
              }
            }
            Unindent(0.0);
            lVar18 = local_188;
          }
        }
      }
      auVar11._8_8_ = 0;
      auVar11[0] = buf[8];
      auVar11[1] = buf[9];
      auVar11[2] = buf[10];
      auVar11[3] = buf[0xb];
      auVar11[4] = buf[0xc];
      auVar11[5] = buf[0xd];
      auVar11[6] = buf[0xe];
      auVar11[7] = buf[0xf];
      buf._0_16_ = auVar11 << 0x40;
      bVar14 = Button("Item Picker..",(ImVec2 *)buf);
      if (bVar14) {
        GImGui->DebugItemPickerActive = true;
      }
      SameLine(0.0,-1.0);
      MetricsHelpMarker(
                       "Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don\'t have a debugger attached, this will probably crash."
                       );
      TreePop();
    }
    local_1b8._0_8_ = &pIVar12->Windows;
    uVar23 = 0;
    bVar14 = TreeNode("Windows","Windows (%d)",(ulong)(uint)(pIVar12->Windows).Size);
    if (bVar14) {
      DebugNodeWindowsList((ImVector<ImGuiWindow_*> *)local_1b8._0_8_,"By display order");
      DebugNodeWindowsList(&pIVar12->WindowsFocusOrder,"By focus order (root windows)");
      bVar14 = TreeNode("By submission order (begin stack)");
      if (bVar14) {
        lVar15 = 0;
        ImVector<ImGuiWindow_*>::resize(&pIVar12->WindowsTempSortBuffer,0);
        for (lVar18 = 0; lVar18 < *(int *)local_1b8._0_8_; lVar18 = lVar18 + 1) {
          ppIVar6 = (pIVar12->Windows).Data;
          if (pIVar12->FrameCount <= *(int *)(*(long *)((long)ppIVar6 + lVar15) + 0x238) + 1) {
            ImVector<ImGuiWindow_*>::push_back
                      (&pIVar12->WindowsTempSortBuffer,(ImGuiWindow **)((long)ppIVar6 + lVar15));
          }
          lVar15 = lVar15 + 8;
        }
        ImQsort((pIVar12->WindowsTempSortBuffer).Data,(long)(pIVar12->WindowsTempSortBuffer).Size,8,
                ShowMetricsWindow::Func::WindowComparerByBeginOrder);
        DebugNodeWindowsListByBeginStackParent
                  ((pIVar12->WindowsTempSortBuffer).Data,(pIVar12->WindowsTempSortBuffer).Size,
                   (ImGuiWindow *)0x0);
        TreePop();
      }
      TreePop();
    }
    uVar30 = (pIVar12->Viewports).Size;
    uVar17 = (ulong)uVar30;
    if ((int)uVar30 < 1) {
      uVar17 = uVar23;
    }
    for (uVar19 = 0; uVar17 != uVar19; uVar19 = uVar19 + 1) {
      pIVar7 = (pIVar12->Viewports).Data[uVar19];
      uVar23 = (ulong)(uint)((int)uVar23 + (pIVar7->DrawDataBuilder).Layers[1].Size +
                            (pIVar7->DrawDataBuilder).Layers[0].Size);
    }
    bVar14 = TreeNode("DrawLists","DrawLists (%d)",uVar23);
    if (bVar14) {
      Checkbox("Show ImDrawCmd mesh when hovering",&(pIVar12->DebugMetricsConfig).ShowDrawCmdMesh);
      Checkbox("Show ImDrawCmd bounding boxes when hovering",
               &(pIVar12->DebugMetricsConfig).ShowDrawCmdBoundingBoxes);
      for (lVar18 = 0; lVar18 < (pIVar12->Viewports).Size; lVar18 = lVar18 + 1) {
        pIVar7 = (pIVar12->Viewports).Data[lVar18];
        for (lVar15 = 0; lVar15 != 2; lVar15 = lVar15 + 1) {
          pIVar27 = (pIVar7->DrawDataBuilder).Layers + lVar15;
          for (lVar24 = 0; lVar24 < pIVar27->Size; lVar24 = lVar24 + 1) {
            DebugNodeDrawList((ImGuiWindow *)0x0,pIVar27->Data[lVar24],"DrawList");
          }
        }
      }
      TreePop();
    }
    bVar14 = TreeNode("Viewports","Viewports (%d)",(ulong)(uint)(pIVar12->Viewports).Size);
    if (bVar14) {
      fVar35 = GetTreeNodeToLabelSpacing();
      Indent(fVar35);
      pIVar13 = GImGui;
      pIVar5 = GImGui->CurrentWindow;
      _local_198 = _DAT_0016a3e0;
      for (lVar18 = 0; uVar23 = (ulong)(pIVar13->Viewports).Size, lVar18 < (long)uVar23;
          lVar18 = lVar18 + 1) {
        IVar40 = ImGuiViewportP::GetMainRect((pIVar13->Viewports).Data[lVar18]);
        uVar33 = -(uint)(IVar40.Min.y < fStack_190);
        uVar34 = -(uint)(IVar40.Min.x < fStack_18c);
        uVar30 = -(uint)((float)local_198._0_4_ < IVar40.Max.y);
        uVar32 = -(uint)((float)local_198._4_4_ < IVar40.Max.x);
        auVar39._0_4_ = ~uVar30 & local_198._0_4_;
        auVar39._4_4_ = ~uVar32 & local_198._4_4_;
        auVar39._8_4_ = ~uVar33 & (uint)fStack_190;
        auVar39._12_4_ = ~uVar34 & (uint)fStack_18c;
        auVar10._4_4_ = (uint)IVar40.Max.x & uVar32;
        auVar10._0_4_ = (uint)IVar40.Max.y & uVar30;
        auVar10._8_4_ = (uint)IVar40.Min.y & uVar33;
        auVar10._12_4_ = (uint)IVar40.Min.x & uVar34;
        _local_198 = auVar39 | auVar10;
      }
      IVar3 = (pIVar5->DC).CursorPos;
      fVar35 = local_198._8_4_;
      fVar36 = local_198._12_4_;
      local_178._8_4_ = fVar35;
      local_178._0_8_ = local_198._8_8_;
      local_178._12_4_ = fVar36;
      local_168 = 0.125;
      fStack_164 = 0.125;
      uStack_160 = 0;
      uStack_15c = 0;
      fStack_180 = 0.0 - fVar35 * 0.0;
      fStack_17c = 0.0 - fVar36 * 0.0;
      local_188 = CONCAT44(IVar3.y - fVar35 * 0.125,IVar3.x - fVar36 * 0.125);
      for (lVar18 = 0; lVar18 < (int)uVar23; lVar18 = lVar18 + 1) {
        pIVar7 = (pIVar13->Viewports).Data[lVar18];
        IVar3 = (pIVar7->super_ImGuiViewport).Pos;
        fVar35 = IVar3.x;
        fVar36 = IVar3.y;
        IVar3 = (pIVar7->super_ImGuiViewport).Size;
        buf._4_4_ = fVar36 * 0.125 + local_188._4_4_;
        buf._0_4_ = fVar35 * 0.125 + (float)local_188;
        buf._8_4_ = (IVar3.x + fVar35) * 0.125 + (float)local_188;
        buf._12_4_ = (IVar3.y + fVar36) * 0.125 + local_188._4_4_;
        DebugRenderViewportThumbnail(pIVar5->DrawList,pIVar7,(ImRect *)buf);
        uVar23 = (ulong)(uint)(pIVar13->Viewports).Size;
      }
      buf._4_4_ = ((float)local_198._0_4_ - (float)local_178._0_4_) * fStack_164;
      buf._0_4_ = ((float)local_198._4_4_ - (float)local_178._4_4_) * local_168;
      Dummy((ImVec2 *)buf);
      fVar35 = GetTreeNodeToLabelSpacing();
      Unindent(fVar35);
      for (lVar18 = 0; lVar18 < (pIVar12->Viewports).Size; lVar18 = lVar18 + 1) {
        DebugNodeViewport((pIVar12->Viewports).Data[lVar18]);
      }
      TreePop();
    }
    bVar14 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(pIVar12->OpenPopupStack).Size);
    if (bVar14) {
      lVar18 = 8;
      for (lVar15 = 0; lVar15 < (pIVar12->OpenPopupStack).Size; lVar15 = lVar15 + 1) {
        pIVar8 = (pIVar12->OpenPopupStack).Data;
        puVar9 = *(undefined8 **)((long)&pIVar8->PopupId + lVar18);
        pcVar20 = "";
        pcVar21 = "NULL";
        if (puVar9 != (undefined8 *)0x0) {
          pcVar21 = (char *)*puVar9;
          pcVar20 = " ChildWindow";
          if ((*(uint *)((long)puVar9 + 0xc) >> 0x18 & 1) == 0) {
            pcVar20 = "";
          }
        }
        BulletText("PopupID: %08x, Window: \'%s\'%s%s",(ulong)*(uint *)((long)pIVar8 + lVar18 + -8),
                   pcVar21,pcVar20);
        lVar18 = lVar18 + 0x30;
      }
      TreePop();
    }
    bVar14 = TreeNode("TabBars","Tab Bars (%d)",(ulong)(uint)(pIVar12->TabBars).AliveCount);
    if (bVar14) {
      lVar18 = 8;
      for (lVar15 = 0; lVar15 < (pIVar12->TabBars).Map.Data.Size; lVar15 = lVar15 + 1) {
        pIVar29 = (pIVar12->TabBars).Buf.Data;
        lVar24 = (long)*(int *)((long)&((pIVar12->TabBars).Map.Data.Data)->key + lVar18);
        if (pIVar29 != (ImGuiTabBar *)0x0 && lVar24 != -1) {
          pIVar29 = pIVar29 + lVar24;
          PushID(pIVar29);
          DebugNodeTabBar(pIVar29,"TabBar");
          pIVar2 = &GImGui->CurrentWindow->IDStack;
          pIVar2->Size = pIVar2->Size + -1;
        }
        lVar18 = lVar18 + 0x10;
      }
      TreePop();
    }
    bVar14 = TreeNode("Tables","Tables (%d)",(ulong)(uint)(pIVar12->Tables).AliveCount);
    if (bVar14) {
      lVar18 = 8;
      for (lVar15 = 0; lVar15 < (pIVar12->Tables).Map.Data.Size; lVar15 = lVar15 + 1) {
        pIVar28 = (pIVar12->Tables).Buf.Data;
        lVar24 = (long)*(int *)((long)&((pIVar12->Tables).Map.Data.Data)->key + lVar18);
        if (pIVar28 != (ImGuiTable *)0x0 && lVar24 != -1) {
          DebugNodeTable(pIVar28 + lVar24);
        }
        lVar18 = lVar18 + 0x10;
      }
      TreePop();
    }
    atlas = (pIVar12->IO).Fonts;
    bVar14 = TreeNode("Fonts","Fonts (%d)",(ulong)(uint)(atlas->Fonts).Size);
    if (bVar14) {
      ShowFontAtlas(atlas);
      TreePop();
    }
    bVar14 = TreeNode("Settings");
    if (bVar14) {
      bVar14 = SmallButton("Clear");
      if (bVar14) {
        ClearIniSettings();
      }
      SameLine(0.0,-1.0);
      bVar14 = SmallButton("Save to memory");
      if (bVar14) {
        SaveIniSettingsToMemory((size_t *)0x0);
      }
      SameLine(0.0,-1.0);
      bVar14 = SmallButton("Save to disk");
      if (bVar14) {
        SaveIniSettingsToDisk((pIVar12->IO).IniFilename);
      }
      SameLine(0.0,-1.0);
      if ((pIVar12->IO).IniFilename == (char *)0x0) {
        TextUnformatted("<NULL>",(char *)0x0);
      }
      else {
        Text("\"%s\"");
      }
      Text("SettingsDirtyTimer %.2f",SUB84((double)pIVar12->SettingsDirtyTimer,0));
      bVar14 = TreeNode("SettingsHandlers","Settings handlers: (%d)",
                        (ulong)(uint)(pIVar12->SettingsHandlers).Size);
      if (bVar14) {
        lVar18 = 0;
        for (lVar15 = 0; lVar15 < (pIVar12->SettingsHandlers).Size; lVar15 = lVar15 + 1) {
          BulletText("%s",*(undefined8 *)
                           ((long)&((pIVar12->SettingsHandlers).Data)->TypeName + lVar18));
          lVar18 = lVar18 + 0x48;
        }
        TreePop();
      }
      bVar14 = TreeNode("SettingsWindows","Settings packed data: Windows: %d bytes",
                        (ulong)(uint)(pIVar12->SettingsWindows).Buf.Size);
      if (bVar14) {
        pcVar21 = (pIVar12->SettingsWindows).Buf.Data;
        settings = (ImGuiWindowSettings *)(pcVar21 + 4);
        if (pcVar21 == (char *)0x0) {
          settings = (ImGuiWindowSettings *)0x0;
        }
        while (settings != (ImGuiWindowSettings *)0x0) {
          DebugNodeWindowSettings(settings);
          iVar22._0_1_ = settings[-1].Collapsed;
          iVar22._1_1_ = settings[-1].WantApply;
          iVar22._2_2_ = *(undefined2 *)&settings[-1].field_0xe;
          settings = (ImGuiWindowSettings *)((long)&settings->ID + (long)iVar22);
          if (settings ==
              (ImGuiWindowSettings *)
              ((pIVar12->SettingsWindows).Buf.Data + (long)(pIVar12->SettingsWindows).Buf.Size + 4))
          {
            settings = (ImGuiWindowSettings *)0x0;
          }
        }
        TreePop();
      }
      bVar14 = TreeNode("SettingsTables","Settings packed data: Tables: %d bytes",
                        (ulong)(uint)(pIVar12->SettingsTables).Buf.Size);
      if (bVar14) {
        pcVar21 = (pIVar12->SettingsTables).Buf.Data;
        settings_00 = (ImGuiTableSettings *)(pcVar21 + 4);
        if (pcVar21 == (char *)0x0) {
          settings_00 = (ImGuiTableSettings *)0x0;
        }
        while (settings_00 != (ImGuiTableSettings *)0x0) {
          DebugNodeTableSettings(settings_00);
          iVar4._0_1_ = settings_00[-1].ColumnsCount;
          iVar4._1_1_ = settings_00[-1].ColumnsCountMax;
          iVar4._2_1_ = settings_00[-1].WantApply;
          iVar4._3_1_ = settings_00[-1].field_0xf;
          settings_00 = (ImGuiTableSettings *)((long)&settings_00->ID + (long)iVar4);
          if (settings_00 ==
              (ImGuiTableSettings *)
              ((pIVar12->SettingsTables).Buf.Data + (long)(pIVar12->SettingsTables).Buf.Size + 4)) {
            settings_00 = (ImGuiTableSettings *)0x0;
          }
        }
        TreePop();
      }
      iVar22 = (pIVar12->SettingsIniData).Buf.Size;
      uVar23 = (ulong)(iVar22 - 1);
      if (iVar22 == 0) {
        uVar23 = 0;
      }
      bVar14 = TreeNode("SettingsIniData","Settings unpacked data (.ini): %d bytes",uVar23);
      if (bVar14) {
        pcVar21 = (pIVar12->SettingsIniData).Buf.Data;
        pcVar20 = ImGuiTextBuffer::EmptyString;
        if (pcVar21 != (char *)0x0) {
          pcVar20 = pcVar21;
        }
        buf._4_4_ = GImGui->FontSize * 20.0;
        buf[0] = '\0';
        buf[1] = '\0';
        buf[2] = -0x80;
        buf[3] = -0x80;
        InputTextMultiline("##Ini",pcVar20,(long)(pIVar12->SettingsIniData).Buf.Size,(ImVec2 *)buf,
                           0x4000,(ImGuiInputTextCallback)0x0,(void *)0x0);
        TreePop();
      }
      TreePop();
    }
    bVar14 = TreeNode("Internal state");
    if (bVar14) {
      pcVar20 = "NULL";
      Text("WINDOWING");
      Indent(0.0);
      pcVar21 = "NULL";
      if (pIVar12->HoveredWindow != (ImGuiWindow *)0x0) {
        pcVar21 = pIVar12->HoveredWindow->Name;
      }
      Text("HoveredWindow: \'%s\'",pcVar21);
      pcVar21 = "NULL";
      if (pIVar12->HoveredWindow != (ImGuiWindow *)0x0) {
        pcVar21 = pIVar12->HoveredWindow->RootWindow->Name;
      }
      Text("HoveredWindow->Root: \'%s\'",pcVar21);
      pcVar21 = "NULL";
      if (pIVar12->HoveredWindowUnderMovingWindow != (ImGuiWindow *)0x0) {
        pcVar21 = pIVar12->HoveredWindowUnderMovingWindow->Name;
      }
      Text("HoveredWindowUnderMovingWindow: \'%s\'",pcVar21);
      pcVar21 = "NULL";
      if (pIVar12->MovingWindow != (ImGuiWindow *)0x0) {
        pcVar21 = pIVar12->MovingWindow->Name;
      }
      uVar23 = 0;
      Text("MovingWindow: \'%s\'",pcVar21);
      Unindent(0.0);
      Text("ITEMS");
      Indent(0.0);
      Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",
           SUB84((double)pIVar12->ActiveIdTimer,0),(ulong)pIVar12->ActiveId,
           (ulong)pIVar12->ActiveIdPreviousFrame,(ulong)pIVar12->ActiveIdAllowOverlap,
           *(undefined8 *)(&DAT_0019d310 + (ulong)pIVar12->ActiveIdSource * 8));
      if (pIVar12->ActiveIdWindow != (ImGuiWindow *)0x0) {
        pcVar20 = pIVar12->ActiveIdWindow->Name;
      }
      Text("ActiveIdWindow: \'%s\'",pcVar20);
      for (uVar30 = 0x200; uVar30 != 0x285; uVar30 = uVar30 + 1) {
        uVar23 = (ulong)((int)uVar23 +
                        (uint)(((pIVar12->ActiveIdUsingKeyInputMask).Storage
                                [(int)(uVar30 - 0x200) >> 5] >> (uVar30 & 0x1f) & 1) != 0));
      }
      Text("ActiveIdUsing: Wheel: %d, NavDirMask: %X, NavInputMask: %X, KeyInputMask: %d key(s)",
           (ulong)pIVar12->ActiveIdUsingMouseWheel,(ulong)pIVar12->ActiveIdUsingNavDirMask,
           (ulong)pIVar12->ActiveIdUsingNavInputMask,uVar23);
      Text("HoveredId: 0x%08X (%.2f sec), AllowOverlap: %d",SUB84((double)pIVar12->HoveredIdTimer,0)
           ,(ulong)pIVar12->HoveredIdPreviousFrame,(ulong)pIVar12->HoveredIdAllowOverlap);
      Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",
           (ulong)pIVar12->DragDropActive,(ulong)(pIVar12->DragDropPayload).SourceId,
           (pIVar12->DragDropPayload).DataType,(ulong)(uint)(pIVar12->DragDropPayload).DataSize);
      Unindent(0.0);
      Text("NAV,FOCUS");
      Indent(0.0);
      pcVar20 = "NULL";
      pcVar21 = "NULL";
      if (pIVar12->NavWindow != (ImGuiWindow *)0x0) {
        pcVar21 = pIVar12->NavWindow->Name;
      }
      Text("NavWindow: \'%s\'",pcVar21);
      Text("NavId: 0x%08X, NavLayer: %d",(ulong)pIVar12->NavId,(ulong)pIVar12->NavLayer);
      Text("NavInputSource: %s",*(undefined8 *)(&DAT_0019d310 + (ulong)pIVar12->NavInputSource * 8))
      ;
      Text("NavActive: %d, NavVisible: %d",(ulong)(pIVar12->IO).NavActive,
           (ulong)(pIVar12->IO).NavVisible);
      Text("NavActivateId/DownId/PressedId/InputId: %08X/%08X/%08X/%08X",
           (ulong)pIVar12->NavActivateId,(ulong)pIVar12->NavActivateDownId,
           (ulong)pIVar12->NavActivatePressedId);
      Text("NavActivateFlags: %04X",(ulong)(uint)pIVar12->NavActivateFlags);
      Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",(ulong)pIVar12->NavDisableHighlight,
           (ulong)pIVar12->NavDisableMouseHover);
      Text("NavFocusScopeId = 0x%08X",(ulong)pIVar12->NavFocusScopeId);
      if (pIVar12->NavWindowingTarget != (ImGuiWindow *)0x0) {
        pcVar20 = pIVar12->NavWindowingTarget->Name;
      }
      Text("NavWindowingTarget: \'%s\'",pcVar20);
      Unindent(0.0);
      TreePop();
    }
    if (((pIVar12->DebugMetricsConfig).ShowWindowsRects != false) ||
       ((pIVar12->DebugMetricsConfig).ShowWindowsBeginOrder == true)) {
      for (lVar18 = 0; lVar18 < *(int *)local_1b8._0_8_; lVar18 = lVar18 + 1) {
        pIVar5 = (pIVar12->Windows).Data[lVar18];
        if (pIVar5->WasActive == true) {
          pIVar16 = GetForegroundDrawList();
          if ((pIVar12->DebugMetricsConfig).ShowWindowsRects == true) {
            buf._0_16_ = (undefined1  [16])
                         ShowMetricsWindow::Funcs::GetWindowRect(pIVar5,*local_1a8);
            ImDrawList::AddRect(pIVar16,(ImVec2 *)buf,(ImVec2 *)(buf + 8),0xff8000ff,0.0,0,1.0);
          }
          if (((pIVar12->DebugMetricsConfig).ShowWindowsBeginOrder == true) &&
             ((pIVar5->Flags & 0x1000000) == 0)) {
            ImFormatString(buf,0x20,"%d",(ulong)(uint)(int)pIVar5->BeginOrderWithinContext);
            local_1c8.y = GImGui->FontSize + (pIVar5->Pos).y;
            local_1c8.x = GImGui->FontSize + (pIVar5->Pos).x;
            ImDrawList::AddRectFilled(pIVar16,&pIVar5->Pos,&local_1c8,0xff6464c8,0.0,0);
            ImDrawList::AddText(pIVar16,&pIVar5->Pos,0xffffffff,buf,(char *)0x0);
          }
        }
      }
    }
    if ((pIVar12->DebugMetricsConfig).ShowTablesRects == true) {
      for (lVar18 = 0; lVar18 < (pIVar12->Tables).Map.Data.Size; lVar18 = lVar18 + 1) {
        pIVar28 = (pIVar12->Tables).Buf.Data;
        lVar15 = (long)(pIVar12->Tables).Map.Data.Data[lVar18].field_1.val_i;
        if ((pIVar28 != (ImGuiTable *)0x0 && lVar15 != -1) &&
           (pIVar28 = pIVar28 + lVar15, pIVar12->FrameCount + -1 <= pIVar28->LastFrameActive)) {
          pIVar16 = GetForegroundDrawList();
          if (*local_1c0 < 6) {
            buf._0_16_ = (undefined1  [16])
                         ShowMetricsWindow::Funcs::GetTableRect(pIVar28,*local_1c0,-1);
            ImDrawList::AddRect(pIVar16,(ImVec2 *)buf,(ImVec2 *)(buf + 8),0xff8000ff,0.0,0,1.0);
          }
          else {
            for (iVar22 = 0; iVar22 < pIVar28->ColumnsCount; iVar22 = iVar22 + 1) {
              buf._0_16_ = (undefined1  [16])
                           ShowMetricsWindow::Funcs::GetTableRect(pIVar28,*local_1c0,iVar22);
              bVar14 = iVar22 == pIVar28->HoveredColumnBody;
              col = 0xff8000ff;
              if (bVar14) {
                col = 0xff80ffff;
              }
              ImDrawList::AddRect(pIVar16,(ImVec2 *)buf,(ImVec2 *)(buf + 8),col,0.0,0,
                                  *(float *)(&DAT_0016b0b8 + (ulong)bVar14 * 4));
            }
          }
        }
      }
    }
    End();
    return;
  }
  End();
  return;
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;
    if (cfg->ShowStackTool)
        ShowStackToolWindow(&cfg->ShowStackTool);

    if (!Begin("Dear ImGui Metrics/Debugger", p_open) || GetCurrentWindow()->BeginCount > 1)
    {
        End();
        return;
    }

    // Basic info
    Text("Dear ImGui %s", GetVersion());
    Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    Text("%d visible windows, %d active allocations", io.MetricsRenderWindows, io.MetricsActiveAllocations);
    //SameLine(); if (SmallButton("GC")) { g.GcCompactAll = true; }

    Separator();

    // Debugging enums
    enum { WRT_OuterRect, WRT_OuterRectClipped, WRT_InnerRect, WRT_InnerClipRect, WRT_WorkRect, WRT_Content, WRT_ContentIdeal, WRT_ContentRegionRect, WRT_Count }; // Windows Rect Type
    const char* wrt_rects_names[WRT_Count] = { "OuterRect", "OuterRectClipped", "InnerRect", "InnerClipRect", "WorkRect", "Content", "ContentIdeal", "ContentRegionRect" };
    enum { TRT_OuterRect, TRT_InnerRect, TRT_WorkRect, TRT_HostClipRect, TRT_InnerClipRect, TRT_BackgroundClipRect, TRT_ColumnsRect, TRT_ColumnsWorkRect, TRT_ColumnsClipRect, TRT_ColumnsContentHeadersUsed, TRT_ColumnsContentHeadersIdeal, TRT_ColumnsContentFrozen, TRT_ColumnsContentUnfrozen, TRT_Count }; // Tables Rect Type
    const char* trt_rects_names[TRT_Count] = { "OuterRect", "InnerRect", "WorkRect", "HostClipRect", "InnerClipRect", "BackgroundClipRect", "ColumnsRect", "ColumnsWorkRect", "ColumnsClipRect", "ColumnsContentHeadersUsed", "ColumnsContentHeadersIdeal", "ColumnsContentFrozen", "ColumnsContentUnfrozen" };
    if (cfg->ShowWindowsRectsType < 0)
        cfg->ShowWindowsRectsType = WRT_WorkRect;
    if (cfg->ShowTablesRectsType < 0)
        cfg->ShowTablesRectsType = TRT_WorkRect;

    struct Funcs
    {
        static ImRect GetTableRect(ImGuiTable* table, int rect_type, int n)
        {
            if (rect_type == TRT_OuterRect)                     { return table->OuterRect; }
            else if (rect_type == TRT_InnerRect)                { return table->InnerRect; }
            else if (rect_type == TRT_WorkRect)                 { return table->WorkRect; }
            else if (rect_type == TRT_HostClipRect)             { return table->HostClipRect; }
            else if (rect_type == TRT_InnerClipRect)            { return table->InnerClipRect; }
            else if (rect_type == TRT_BackgroundClipRect)       { return table->BgClipRect; }
            else if (rect_type == TRT_ColumnsRect)              { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->MinX, table->InnerClipRect.Min.y, c->MaxX, table->InnerClipRect.Min.y + table->LastOuterHeight); }
            else if (rect_type == TRT_ColumnsWorkRect)          { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->WorkRect.Min.y, c->WorkMaxX, table->WorkRect.Max.y); }
            else if (rect_type == TRT_ColumnsClipRect)          { ImGuiTableColumn* c = &table->Columns[n]; return c->ClipRect; }
            else if (rect_type == TRT_ColumnsContentHeadersUsed){ ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersUsed, table->InnerClipRect.Min.y + table->LastFirstRowHeight); } // Note: y1/y2 not always accurate
            else if (rect_type == TRT_ColumnsContentHeadersIdeal){ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersIdeal, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentFrozen)     { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXFrozen, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentUnfrozen)   { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y + table->LastFirstRowHeight, c->ContentMaxXUnfrozen, table->InnerClipRect.Max.y); }
            IM_ASSERT(0);
            return ImRect();
        }

        static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)       { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentIdeal)         { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSizeIdeal); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }
    };

    // Tools
    if (TreeNode("Tools"))
    {
        // Stack Tool is your best friend!
        Checkbox("Show stack tool", &cfg->ShowStackTool);
        SameLine();
        MetricsHelpMarker("You can also call ImGui::ShowStackToolWindow() from your code.");

        Checkbox("Show windows begin order", &cfg->ShowWindowsBeginOrder);
        Checkbox("Show windows rectangles", &cfg->ShowWindowsRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowWindowsRects |= Combo("##show_windows_rect_type", &cfg->ShowWindowsRectsType, wrt_rects_names, WRT_Count, WRT_Count);
        if (cfg->ShowWindowsRects && g.NavWindow != NULL)
        {
            BulletText("'%s':", g.NavWindow->Name);
            Indent();
            for (int rect_n = 0; rect_n < WRT_Count; rect_n++)
            {
                ImRect r = Funcs::GetWindowRect(g.NavWindow, rect_n);
                Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), wrt_rects_names[rect_n]);
            }
            Unindent();
        }

        Checkbox("Show tables rectangles", &cfg->ShowTablesRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowTablesRects |= Combo("##show_table_rects_type", &cfg->ShowTablesRectsType, trt_rects_names, TRT_Count, TRT_Count);
        if (cfg->ShowTablesRects && g.NavWindow != NULL)
        {
            for (int table_n = 0; table_n < g.Tables.GetMapSize(); table_n++)
            {
                ImGuiTable* table = g.Tables.TryGetMapData(table_n);
                if (table == NULL || table->LastFrameActive < g.FrameCount - 1 || (table->OuterWindow != g.NavWindow && table->InnerWindow != g.NavWindow))
                    continue;

                BulletText("Table 0x%08X (%d columns, in '%s')", table->ID, table->ColumnsCount, table->OuterWindow->Name);
                if (IsItemHovered())
                    GetForegroundDrawList()->AddRect(table->OuterRect.Min - ImVec2(1, 1), table->OuterRect.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, 0, 2.0f);
                Indent();
                char buf[128];
                for (int rect_n = 0; rect_n < TRT_Count; rect_n++)
                {
                    if (rect_n >= TRT_ColumnsRect)
                    {
                        if (rect_n != TRT_ColumnsRect && rect_n != TRT_ColumnsClipRect)
                            continue;
                        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                        {
                            ImRect r = Funcs::GetTableRect(table, rect_n, column_n);
                            ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), column_n, trt_rects_names[rect_n]);
                            Selectable(buf);
                            if (IsItemHovered())
                                GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, 0, 2.0f);
                        }
                    }
                    else
                    {
                        ImRect r = Funcs::GetTableRect(table, rect_n, -1);
                        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), trt_rects_names[rect_n]);
                        Selectable(buf);
                        if (IsItemHovered())
                            GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, 0, 2.0f);
                    }
                }
                Unindent();
            }
        }

        // The Item Picker tool is super useful to visually select an item and break into the call-stack of where it was submitted.
        if (Button("Item Picker.."))
            DebugStartItemPicker();
        SameLine();
        MetricsHelpMarker("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don't have a debugger attached, this will probably crash.");

        TreePop();
    }

    // Windows
    if (TreeNode("Windows", "Windows (%d)", g.Windows.Size))
    {
        //SetNextItemOpen(true, ImGuiCond_Once);
        DebugNodeWindowsList(&g.Windows, "By display order");
        DebugNodeWindowsList(&g.WindowsFocusOrder, "By focus order (root windows)");
        if (TreeNode("By submission order (begin stack)"))
        {
            // Here we display windows in their submitted order/hierarchy, however note that the Begin stack doesn't constitute a Parent<>Child relationship!
            ImVector<ImGuiWindow*>& temp_buffer = g.WindowsTempSortBuffer;
            temp_buffer.resize(0);
            for (int i = 0; i < g.Windows.Size; i++)
                if (g.Windows[i]->LastFrameActive + 1 >= g.FrameCount)
                    temp_buffer.push_back(g.Windows[i]);
            struct Func { static int IMGUI_CDECL WindowComparerByBeginOrder(const void* lhs, const void* rhs) { return ((int)(*(const ImGuiWindow* const *)lhs)->BeginOrderWithinContext - (*(const ImGuiWindow* const*)rhs)->BeginOrderWithinContext); } };
            ImQsort(temp_buffer.Data, (size_t)temp_buffer.Size, sizeof(ImGuiWindow*), Func::WindowComparerByBeginOrder);
            DebugNodeWindowsListByBeginStackParent(temp_buffer.Data, temp_buffer.Size, NULL);
            TreePop();
        }

        TreePop();
    }

    // DrawLists
    int drawlist_count = 0;
    for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        drawlist_count += g.Viewports[viewport_i]->DrawDataBuilder.GetDrawListCount();
    if (TreeNode("DrawLists", "DrawLists (%d)", drawlist_count))
    {
        Checkbox("Show ImDrawCmd mesh when hovering", &cfg->ShowDrawCmdMesh);
        Checkbox("Show ImDrawCmd bounding boxes when hovering", &cfg->ShowDrawCmdBoundingBoxes);
        for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        {
            ImGuiViewportP* viewport = g.Viewports[viewport_i];
            for (int layer_i = 0; layer_i < IM_ARRAYSIZE(viewport->DrawDataBuilder.Layers); layer_i++)
                for (int draw_list_i = 0; draw_list_i < viewport->DrawDataBuilder.Layers[layer_i].Size; draw_list_i++)
                    DebugNodeDrawList(NULL, viewport->DrawDataBuilder.Layers[layer_i][draw_list_i], "DrawList");
        }
        TreePop();
    }

    // Viewports
    if (TreeNode("Viewports", "Viewports (%d)", g.Viewports.Size))
    {
        Indent(GetTreeNodeToLabelSpacing());
        RenderViewportsThumbnails();
        Unindent(GetTreeNodeToLabelSpacing());
        for (int i = 0; i < g.Viewports.Size; i++)
            DebugNodeViewport(g.Viewports[i]);
        TreePop();
    }

    // Details for Popups
    if (TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        TreePop();
    }

    // Details for TabBars
    if (TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.GetAliveCount()))
    {
        for (int n = 0; n < g.TabBars.GetMapSize(); n++)
            if (ImGuiTabBar* tab_bar = g.TabBars.TryGetMapData(n))
            {
                PushID(tab_bar);
                DebugNodeTabBar(tab_bar, "TabBar");
                PopID();
            }
        TreePop();
    }

    // Details for Tables
    if (TreeNode("Tables", "Tables (%d)", g.Tables.GetAliveCount()))
    {
        for (int n = 0; n < g.Tables.GetMapSize(); n++)
            if (ImGuiTable* table = g.Tables.TryGetMapData(n))
                DebugNodeTable(table);
        TreePop();
    }

    // Details for Fonts
#ifndef IMGUI_DISABLE_DEMO_WINDOWS
    ImFontAtlas* atlas = g.IO.Fonts;
    if (TreeNode("Fonts", "Fonts (%d)", atlas->Fonts.Size))
    {
        ShowFontAtlas(atlas);
        TreePop();
    }
#endif

    // Details for Docking
#ifdef IMGUI_HAS_DOCK
    if (TreeNode("Docking"))
    {
        TreePop();
    }
#endif // #ifdef IMGUI_HAS_DOCK

    // Settings
    if (TreeNode("Settings"))
    {
        if (SmallButton("Clear"))
            ClearIniSettings();
        SameLine();
        if (SmallButton("Save to memory"))
            SaveIniSettingsToMemory();
        SameLine();
        if (SmallButton("Save to disk"))
            SaveIniSettingsToDisk(g.IO.IniFilename);
        SameLine();
        if (g.IO.IniFilename)
            Text("\"%s\"", g.IO.IniFilename);
        else
            TextUnformatted("<NULL>");
        Text("SettingsDirtyTimer %.2f", g.SettingsDirtyTimer);
        if (TreeNode("SettingsHandlers", "Settings handlers: (%d)", g.SettingsHandlers.Size))
        {
            for (int n = 0; n < g.SettingsHandlers.Size; n++)
                BulletText("%s", g.SettingsHandlers[n].TypeName);
            TreePop();
        }
        if (TreeNode("SettingsWindows", "Settings packed data: Windows: %d bytes", g.SettingsWindows.size()))
        {
            for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
                DebugNodeWindowSettings(settings);
            TreePop();
        }

        if (TreeNode("SettingsTables", "Settings packed data: Tables: %d bytes", g.SettingsTables.size()))
        {
            for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
                DebugNodeTableSettings(settings);
            TreePop();
        }

#ifdef IMGUI_HAS_DOCK
#endif // #ifdef IMGUI_HAS_DOCK

        if (TreeNode("SettingsIniData", "Settings unpacked data (.ini): %d bytes", g.SettingsIniData.size()))
        {
            InputTextMultiline("##Ini", (char*)(void*)g.SettingsIniData.c_str(), g.SettingsIniData.Buf.Size, ImVec2(-FLT_MIN, GetTextLineHeight() * 20), ImGuiInputTextFlags_ReadOnly);
            TreePop();
        }
        TreePop();
    }

    // Misc Details
    if (TreeNode("Internal state"))
    {
        Text("WINDOWING");
        Indent();
        Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        Text("HoveredWindow->Root: '%s'", g.HoveredWindow ? g.HoveredWindow->RootWindow->Name : "NULL");
        Text("HoveredWindowUnderMovingWindow: '%s'", g.HoveredWindowUnderMovingWindow ? g.HoveredWindowUnderMovingWindow->Name : "NULL");
        Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        Unindent();

        Text("ITEMS");
        Indent();
        Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, GetInputSourceName(g.ActiveIdSource));
        Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");

        int active_id_using_key_input_count = 0;
        for (int n = ImGuiKey_NamedKey_BEGIN; n < ImGuiKey_NamedKey_END; n++)
            active_id_using_key_input_count += g.ActiveIdUsingKeyInputMask[n] ? 1 : 0;
        Text("ActiveIdUsing: Wheel: %d, NavDirMask: %X, NavInputMask: %X, KeyInputMask: %d key(s)", g.ActiveIdUsingMouseWheel, g.ActiveIdUsingNavDirMask, g.ActiveIdUsingNavInputMask, active_id_using_key_input_count);
        Text("HoveredId: 0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Not displaying g.HoveredId as it is update mid-frame
        Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        Unindent();

        Text("NAV,FOCUS");
        Indent();
        Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        Text("NavInputSource: %s", GetInputSourceName(g.NavInputSource));
        Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        Text("NavActivateId/DownId/PressedId/InputId: %08X/%08X/%08X/%08X", g.NavActivateId, g.NavActivateDownId, g.NavActivatePressedId, g.NavActivateInputId);
        Text("NavActivateFlags: %04X", g.NavActivateFlags);
        Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        Text("NavFocusScopeId = 0x%08X", g.NavFocusScopeId);
        Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        Unindent();

        TreePop();
    }

    // Overlay: Display windows Rectangles and Begin Order
    if (cfg->ShowWindowsRects || cfg->ShowWindowsBeginOrder)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if (!window->WasActive)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(window);
            if (cfg->ShowWindowsRects)
            {
                ImRect r = Funcs::GetWindowRect(window, cfg->ShowWindowsRectsType);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
            if (cfg->ShowWindowsBeginOrder && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            {
                char buf[32];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
                float font_size = GetFontSize();
                draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
                draw_list->AddText(window->Pos, IM_COL32(255, 255, 255, 255), buf);
            }
        }
    }

    // Overlay: Display Tables Rectangles
    if (cfg->ShowTablesRects)
    {
        for (int table_n = 0; table_n < g.Tables.GetMapSize(); table_n++)
        {
            ImGuiTable* table = g.Tables.TryGetMapData(table_n);
            if (table == NULL || table->LastFrameActive < g.FrameCount - 1)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(table->OuterWindow);
            if (cfg->ShowTablesRectsType >= TRT_ColumnsRect)
            {
                for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                {
                    ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, column_n);
                    ImU32 col = (table->HoveredColumnBody == column_n) ? IM_COL32(255, 255, 128, 255) : IM_COL32(255, 0, 128, 255);
                    float thickness = (table->HoveredColumnBody == column_n) ? 3.0f : 1.0f;
                    draw_list->AddRect(r.Min, r.Max, col, 0.0f, 0, thickness);
                }
            }
            else
            {
                ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, -1);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
        }
    }

#ifdef IMGUI_HAS_DOCK
    // Overlay: Display Docking info
    if (show_docking_nodes && g.IO.KeyCtrl)
    {
    }
#endif // #ifdef IMGUI_HAS_DOCK

    End();
}